

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::getQuoted(Nibbler *this,char c,string *result,bool quote)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ulong local_38;
  size_type i;
  char current;
  char previous;
  bool inescape;
  bool inquote;
  bool quote_local;
  string *result_local;
  char c_local;
  Nibbler *this_local;
  
  bVar3 = false;
  bVar2 = false;
  i._4_1_ = '\0';
  std::__cxx11::string::operator=((string *)result,"");
  if ((this->_cursor < this->_length) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar4 == c)) {
    for (local_38 = this->_cursor; local_38 < this->_length; local_38 = local_38 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
      cVar1 = *pcVar4;
      if ((cVar1 != '\\') || (bVar2)) {
        if ((cVar1 != c) || (bVar2)) {
          if (i._4_1_ != '\0') {
            std::__cxx11::string::operator+=((string *)result,i._4_1_);
            i._4_1_ = '\0';
          }
          std::__cxx11::string::operator+=((string *)result,cVar1);
          bVar2 = false;
        }
        else {
          if (quote) {
            std::__cxx11::string::operator+=((string *)result,cVar1);
          }
          if (bVar3) {
            this->_cursor = local_38 + 1;
            return true;
          }
          bVar3 = true;
        }
      }
      else {
        bVar2 = true;
        i._4_1_ = '\\';
      }
    }
  }
  return false;
}

Assistant:

bool Nibbler::getQuoted (
  char c,
  std::string& result,
  bool quote /* = false */)
{
  bool inquote = false;
  bool inescape = false;
  char previous = 0;
  char current = 0;
  result = "";

  if (_cursor >= _length ||
      _input[_cursor] != c)
  {
    return false;
  }

  for (std::string::size_type i = _cursor; i < _length; ++i)
  {
    current = _input[i];

    if (current == '\\' && !inescape)
    {
      inescape = true;
      previous = current;
      continue;
    }

    if (current == c && !inescape)
    {
      if (quote)
        result += current;

      if (!inquote)
      {
        inquote = true;
      }
      else
      {
        _cursor = i + 1;
        return true;
      }
    }
    else
    {
      if (previous)
      {
        result += previous;
        previous = 0;
      }

      result += current;
      inescape = false;
    }
  }

  return false;
}